

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int __thiscall Pathie::Path::stat(Path *this,char *__file,stat *__buf)

{
  int iVar1;
  stat *__buf_00;
  char *__file_00;
  ErrnoError *this_00;
  int *piVar2;
  undefined1 local_38 [8];
  string nstr;
  stat *s;
  Path *this_local;
  
  __buf_00 = (stat *)malloc(0x90);
  native_abi_cxx11_((Path *)local_38);
  __file_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::stat(__file_00,__buf_00);
  if (iVar1 < 0) {
    this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    ErrnoError::ErrnoError(this_00,*piVar2);
    __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
  }
  std::__cxx11::string::~string((string *)local_38);
  return (int)__buf_00;
}

Assistant:

struct stat* Path::stat() const
{
  struct stat* s = (struct stat*) malloc(sizeof(struct stat));
  std::string nstr = native();

  if (::stat(nstr.c_str(), s) < 0)
    throw(Pathie::ErrnoError(errno));

  return s;
}